

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O3

string * XPMP2::GetXPSystemPath_abi_cxx11_(void)

{
  size_type sVar1;
  char s [512];
  char acStack_218 [512];
  
  if (GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_ == '\0') {
    GetXPSystemPath_abi_cxx11_();
  }
  if (GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_._M_string_length == 0) {
    XPLMGetSystemPath(acStack_218);
    sVar1 = GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_._M_string_length;
    strlen(acStack_218);
    std::__cxx11::string::_M_replace(0x2ec890,0,(char *)sVar1,(ulong)acStack_218);
  }
  return &GetXPSystemPath[abi:cxx11]()::sysDir_abi_cxx11_;
}

Assistant:

const std::string& GetXPSystemPath ()
{
    // Fetch XP's system dir once
    static std::string sysDir;
    if (sysDir.empty()) {
        char s[512];
        XPLMGetSystemPath(s);
        sysDir = s;
    }
    return sysDir;
}